

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-poll.c
# Opt level: O3

int run_test_fs_poll_close_request_multi_stop_start(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  undefined1 *puVar3;
  undefined8 uVar4;
  undefined1 *unaff_RBX;
  uv_fs_poll_t poll_handle;
  uv_loop_t loop;
  undefined1 auStack_798 [104];
  undefined1 auStack_730 [848];
  code *pcStack_3e0;
  undefined1 auStack_3d8 [104];
  undefined1 local_370 [848];
  
  puVar3 = auStack_3d8;
  pcStack_3e0 = (code *)0x152442;
  remove("testfile");
  pcStack_3e0 = (code *)0x15244c;
  iVar1 = uv_loop_init(local_370);
  if (iVar1 == 0) {
    pcStack_3e0 = (code *)0x152461;
    iVar1 = uv_fs_poll_init(local_370,auStack_3d8);
    if (iVar1 != 0) goto LAB_00152546;
    iVar1 = 10;
    do {
      pcStack_3e0 = (code *)0x152487;
      iVar2 = uv_fs_poll_stop(auStack_3d8);
      if (iVar2 != 0) {
LAB_00152537:
        pcStack_3e0 = (code *)0x15253c;
        run_test_fs_poll_close_request_multi_stop_start_cold_3();
        goto LAB_0015253c;
      }
      pcStack_3e0 = (code *)0x1524a2;
      iVar2 = uv_fs_poll_start(auStack_3d8,poll_cb_fail,"testfile",100);
      if (iVar2 != 0) {
        pcStack_3e0 = (code *)0x152537;
        run_test_fs_poll_close_request_multi_stop_start_cold_4();
        goto LAB_00152537;
      }
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    pcStack_3e0 = (code *)0x1524bd;
    uv_close(auStack_3d8,close_cb);
    puVar3 = local_370;
    while (close_cb_called == 0) {
      pcStack_3e0 = (code *)0x1524d9;
      uv_run(puVar3,1);
    }
    if (close_cb_called != 1) {
LAB_0015253c:
      pcStack_3e0 = (code *)0x152541;
      run_test_fs_poll_close_request_multi_stop_start_cold_7();
      unaff_RBX = puVar3;
      goto LAB_00152541;
    }
    pcStack_3e0 = (code *)0x1524ea;
    iVar1 = uv_loop_close(local_370);
    if (iVar1 != 0) goto LAB_0015254b;
    pcStack_3e0 = (code *)0x1524f3;
    puVar3 = (undefined1 *)uv_default_loop();
    pcStack_3e0 = (code *)0x152507;
    uv_walk(puVar3,close_walk_cb,0);
    pcStack_3e0 = (code *)0x152511;
    uv_run(puVar3,0);
    pcStack_3e0 = (code *)0x152516;
    uVar4 = uv_default_loop();
    pcStack_3e0 = (code *)0x15251e;
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
LAB_00152541:
    pcStack_3e0 = (code *)0x152546;
    run_test_fs_poll_close_request_multi_stop_start_cold_1();
LAB_00152546:
    puVar3 = unaff_RBX;
    pcStack_3e0 = (code *)0x15254b;
    run_test_fs_poll_close_request_multi_stop_start_cold_2();
LAB_0015254b:
    pcStack_3e0 = (code *)0x152550;
    run_test_fs_poll_close_request_multi_stop_start_cold_5();
  }
  pcStack_3e0 = run_test_fs_poll_close_request_stop_when_active;
  run_test_fs_poll_close_request_multi_stop_start_cold_6();
  pcStack_3e0 = (code *)puVar3;
  remove("testfile");
  iVar1 = uv_loop_init(auStack_730);
  if (iVar1 == 0) {
    iVar1 = uv_fs_poll_init(auStack_730,auStack_798);
    if (iVar1 != 0) goto LAB_00152663;
    iVar1 = uv_fs_poll_start(auStack_798,poll_cb_noop,"testfile",100);
    if (iVar1 != 0) goto LAB_00152668;
    uv_run(auStack_730,1);
    iVar1 = uv_fs_poll_stop(auStack_798);
    if (iVar1 != 0) goto LAB_0015266d;
    uv_run(auStack_730,1);
    uv_close(auStack_798,close_cb);
    uv_run(auStack_730,1);
    if (close_cb_called != 1) goto LAB_00152672;
    iVar1 = uv_loop_close(auStack_730);
    if (iVar1 == 0) {
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      uv_run(uVar4,0);
      uVar4 = uv_default_loop();
      iVar1 = uv_loop_close(uVar4);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0015267c;
    }
  }
  else {
    run_test_fs_poll_close_request_stop_when_active_cold_1();
LAB_00152663:
    run_test_fs_poll_close_request_stop_when_active_cold_2();
LAB_00152668:
    run_test_fs_poll_close_request_stop_when_active_cold_3();
LAB_0015266d:
    run_test_fs_poll_close_request_stop_when_active_cold_4();
LAB_00152672:
    run_test_fs_poll_close_request_stop_when_active_cold_5();
  }
  run_test_fs_poll_close_request_stop_when_active_cold_6();
LAB_0015267c:
  run_test_fs_poll_close_request_stop_when_active_cold_7();
  return extraout_EAX;
}

Assistant:

TEST_IMPL(fs_poll_close_request_multi_stop_start) {
  uv_loop_t loop;
  uv_fs_poll_t poll_handle;
  int i;

  remove(FIXTURE);

  ASSERT(0 == uv_loop_init(&loop));

  ASSERT(0 == uv_fs_poll_init(&loop, &poll_handle));

  for (i = 0; i < 10; ++i) {
    ASSERT(0 == uv_fs_poll_stop(&poll_handle));
    ASSERT(0 == uv_fs_poll_start(&poll_handle, poll_cb_fail, FIXTURE, 100));
  }
  uv_close((uv_handle_t*) &poll_handle, close_cb);
  while (close_cb_called == 0)
    uv_run(&loop, UV_RUN_ONCE);
  ASSERT(close_cb_called == 1);

  ASSERT(0 == uv_loop_close(&loop));

  MAKE_VALGRIND_HAPPY();
  return 0;
}